

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  Pacman_AI_Agent PVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  RL_Pacman_Agent *this;
  undefined **ppuVar5;
  NN_Pacman_Agent *this_00;
  time_t __val;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  undefined4 in_register_0000003c;
  int i;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  Neural_Network *pNVar14;
  Neural_Network *pNVar15;
  Neural_Network *pNVar16;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int local_c44;
  Neural_Network *local_c40;
  Neural_Network *local_c38;
  Neural_Network *local_c30;
  allocator_type local_c21;
  Neural_Network *local_c20;
  RL_Pacman_Agent *local_c18;
  Neural_Network *local_c10;
  vector<Neural_Network,_std::allocator<Neural_Network>_> max_nns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  string statistics_path;
  string arguments_json;
  string nn_id;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  json;
  vector<Neural_Network,_std::allocator<Neural_Network>_> last_nns;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b40;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b28;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  StatisticInfo local_9e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c8 [4];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_888;
  Statistics s_log_test;
  Statistics s_log;
  char str [200];
  Statistics s_test;
  Game game;
  
  lVar7 = std::cout;
  *(uint *)(std::operator>> + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::operator>> + *(long *)(std::cout + -0x18)) | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar7 + -0x18)) = 1;
  Arguments::init((Arguments *)CONCAT44(in_register_0000003c,argc),(EVP_PKEY_CTX *)argv);
  Arguments::postprocess();
  srand(Arguments::random_seed);
  Game::Game(&game);
  Game::load_maze(&game);
  switch(Arguments::pacman_ai_agent) {
  case PATHFINDING:
    this = (RL_Pacman_Agent *)operator_new(8);
    ppuVar5 = &PTR_take_action_0011fb70;
    break;
  case INPUT:
    this = (RL_Pacman_Agent *)operator_new(8);
    ppuVar5 = &PTR_take_action_0011fbf8;
    break;
  case RANDOM:
    this = (RL_Pacman_Agent *)operator_new(8);
    ppuVar5 = &PTR_take_action_0011fc50;
    break;
  case RL:
    this = (RL_Pacman_Agent *)operator_new(0x118);
    RL_Pacman_Agent::RL_Pacman_Agent(this);
    goto LAB_0010682d;
  case NN:
    this = (RL_Pacman_Agent *)operator_new(200);
    std::__cxx11::string::string
              ((string *)&local_a00,(string *)&Arguments::neural_network_path_abi_cxx11_);
    NN_Pacman_Agent::NN_Pacman_Agent((NN_Pacman_Agent *)this,&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    goto LAB_0010682d;
  default:
    builtin_strncpy(str,"Invalid pacman AI Agent enum value",0x23);
    poVar6 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/main.cc"
                            );
    poVar6 = std::operator<<(poVar6,"][");
    poVar6 = std::operator<<(poVar6,"main");
    poVar6 = std::operator<<(poVar6,"][Line ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x98);
    poVar6 = std::operator<<(poVar6,"] ");
    poVar6 = std::operator<<(poVar6,str);
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(1);
  }
  (this->super_Agent)._vptr_Agent = (_func_int **)ppuVar5;
LAB_0010682d:
  game.pacman = &this->super_Agent;
  Statistics::Statistics(&s_log,Arguments::logging_statistics_precision);
  Statistics::Statistics(&s_test,Arguments::test_statistics_precision);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            (&max_nns,(long)Arguments::test_sampling,(allocator_type *)str);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            (&last_nns,(long)Arguments::test_sampling,(allocator_type *)str);
  PVar2 = Arguments::pacman_ai_agent;
  poVar6 = std::operator<<((ostream *)&std::cout,"Wins || Completion");
  pcVar9 = "";
  if (PVar2 == RL) {
    pcVar9 = " || MSE";
  }
  poVar6 = std::operator<<(poVar6,pcVar9);
  poVar6 = std::operator<<(poVar6," (Last ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," :: Always)");
  std::endl<char,std::char_traits<char>>(poVar6);
  dVar1 = (double)Arguments::plays * Arguments::nn_evaluation_start;
  local_c20 = &this->nn;
  local_c40 = (Neural_Network *)0xbff0000000000000;
  local_c18 = this;
  for (iVar8 = 0; iVar8 < Arguments::plays; iVar8 = iVar8 + 1) {
    if ((PVar2 == RL) && (iVar8 % Arguments::test_sampling_interval == 0)) {
      Neural_Network::from_weights
                (last_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 (int)((long)((ulong)(uint)((int)((long)iVar8 %
                                                 (long)Arguments::test_statistics_precision) >> 0x1f
                                           ) << 0x20 |
                             (long)iVar8 % (long)Arguments::test_statistics_precision & 0xffffffffU)
                      / (long)Arguments::test_sampling_interval),local_c20);
    }
    Game::play(&game);
    str._16_8_ = 0.0;
    if (PVar2 == RL) {
      str._16_8_ = (double)local_c18->mse_sum_last / (double)game.state.round;
    }
    str._0_8_ = (undefined8)(int)game.result.won;
    str._8_8_ = game.result.completion;
    Statistics::new_observation(&s_log,(StatisticInfo *)str);
    Statistics::new_observation(&s_test,(StatisticInfo *)str);
    if ((int)dVar1 <= iVar8 && PVar2 == RL) {
      if (Arguments::nn_evaluation_attribute == WINS) {
        Statistics::avg((StatisticInfo *)&s_log_test,&s_test);
        uVar12 = s_log_test.precision;
        uVar13 = s_log_test.observation_count;
      }
      else {
        Statistics::avg((StatisticInfo *)&s_log_test,&s_test);
        uVar12 = (uint)s_log_test.Q.c.
                       super__Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>._M_impl.
                       super__Deque_impl_data._M_map;
        uVar13 = (uint)((ulong)s_log_test.Q.c.
                               super__Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>.
                               _M_impl.super__Deque_impl_data._M_map >> 0x20);
      }
      if ((double)local_c40 <= (double)CONCAT44(uVar13,uVar12) &&
          (double)CONCAT44(uVar13,uVar12) != (double)local_c40) {
        for (uVar10 = 0; uVar11 = (ulong)uVar10,
            uVar11 < (ulong)(((long)max_nns.
                                    super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)max_nns.
                                   super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xa8);
            uVar10 = uVar10 + 1) {
          Neural_Network::from_weights
                    (max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11,
                     last_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11);
        }
        local_c40 = (Neural_Network *)CONCAT44(uVar13,uVar12);
      }
    }
    if (iVar8 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
      std::operator<<((ostream *)&std::cout,"\r");
      print_info(&s_log,PVar2 == RL);
      if ((int)dVar1 <= iVar8 && PVar2 == RL) {
        std::operator<<((ostream *)&std::cout," ** Max wins: ");
        std::ostream::_M_insert<double>((double)local_c40 * 100.0);
      }
      std::operator<<((ostream *)&std::cout,"  ");
      std::ostream::flush();
    }
    Game::reset(&game);
  }
  nn_id._M_dataplus._M_p = (pointer)&nn_id.field_2;
  nn_id._M_string_length = 0;
  nn_id.field_2._M_local_buf[0] = '\0';
  if ((PVar2 == RL) &&
     ((max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
       super__Vector_impl_data._M_start)->reserved == true)) {
    local_c38 = (Neural_Network *)0xbff0000000000000;
    uVar10 = 0;
    local_c44 = -1;
    while( true ) {
      local_c18 = (RL_Pacman_Agent *)CONCAT44(local_c18._4_4_,uVar10);
      if ((ulong)(((long)max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xa8) <= (ulong)uVar10) break;
      poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar6 = std::operator<<(poVar6,"Testing best agent: Wins || Completion (");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," before)");
      std::endl<char,std::char_traits<char>>(poVar6);
      Game::Game((Game *)str);
      Game::load_maze((Game *)str);
      this_00 = (NN_Pacman_Agent *)operator_new(200);
      NN_Pacman_Agent::NN_Pacman_Agent
                (this_00,max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar10);
      str._24_7_ = SUB87(this_00,0);
      str[0x1f] = (char)((ulong)this_00 >> 0x38);
      Statistics::Statistics(&s_log_test,Arguments::logging_statistics_precision);
      local_c40 = (Neural_Network *)0x0;
      local_c30 = (Neural_Network *)0x0;
      for (iVar8 = 0; iVar8 < Arguments::n_games_test; iVar8 = iVar8 + 1) {
        Game::play((Game *)str);
        local_9c8[0].first._M_dataplus._M_p = (pointer)(double)(int)str[0x20];
        local_9c8[0].first._M_string_length._0_1_ = str[0x28];
        local_9c8[0].first._M_string_length._1_1_ = str[0x29];
        local_9c8[0].first._M_string_length._2_1_ = str[0x2a];
        local_9c8[0].first._M_string_length._3_1_ = str[0x2b];
        local_9c8[0].first._M_string_length._4_1_ = str[0x2c];
        local_9c8[0].first._M_string_length._5_1_ = str[0x2d];
        local_9c8[0].first._M_string_length._6_1_ = str[0x2e];
        local_9c8[0].first._M_string_length._7_1_ = str[0x2f];
        local_9c8[0].first.field_2._M_allocated_capacity = 0;
        Statistics::new_observation(&s_log_test,(StatisticInfo *)local_9c8);
        if (iVar8 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
          Statistics::avg_always((StatisticInfo *)local_9c8,&s_log_test);
          sVar4 = local_9c8[0].first._M_string_length;
          _Var3._M_p = local_9c8[0].first._M_dataplus._M_p;
          local_c40 = (Neural_Network *)local_9c8[0].first._M_dataplus._M_p;
          local_c30 = (Neural_Network *)local_9c8[0].first._M_string_length;
          poVar6 = std::operator<<((ostream *)&std::cout,"\r[");
          poVar6 = (ostream *)
                   std::ostream::operator<<((ostream *)poVar6,(int)s_log_test.totals_always.won);
          poVar6 = std::operator<<(poVar6,"/");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6,"] ");
          poVar6 = std::ostream::_M_insert<double>((double)_Var3._M_p * 100.0);
          std::operator<<(poVar6,"% || ");
          poVar6 = std::ostream::_M_insert<double>((double)sVar4 * 100.0);
          std::operator<<(poVar6,"%");
          std::ostream::flush();
        }
        Game::reset((Game *)str);
      }
      pNVar16 = local_c38;
      if (Arguments::nn_evaluation_attribute == COMPLETION) {
        pNVar14 = local_c10;
        pNVar15 = local_c20;
        iVar8 = local_c44;
        if ((double)local_c38 < (double)local_c30) {
          pNVar14 = local_c30;
          pNVar15 = local_c40;
          pNVar16 = local_c30;
          iVar8 = (int)local_c18;
        }
      }
      else {
        pNVar14 = local_c10;
        pNVar15 = local_c20;
        iVar8 = local_c44;
        if ((Arguments::nn_evaluation_attribute == WINS) &&
           (pNVar14 = local_c30, pNVar15 = local_c40, pNVar16 = local_c40, iVar8 = (int)local_c18,
           (double)local_c40 <= (double)local_c38)) {
          pNVar14 = local_c10;
          pNVar15 = local_c20;
          pNVar16 = local_c38;
          iVar8 = local_c44;
        }
      }
      std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
                ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)&s_log_test.Q);
      Game::~Game((Game *)str);
      uVar10 = (int)local_c18 + 1;
      local_c44 = iVar8;
      local_c38 = pNVar16;
      local_c20 = pNVar15;
      local_c10 = pNVar14;
    }
    id_abi_cxx11_();
    std::operator+(&local_9c8[0].first,"nn",&arguments_json);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s_log_test,
                   &local_9c8[0].first,"-");
    std::__cxx11::to_string(&local_a20,(int)((double)local_c38 * 1000.0));
    pad(&statistics_path,&local_a20,'0',3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s_log_test,
                   &statistics_path);
    std::__cxx11::string::operator=((string *)&nn_id,(string *)str);
    std::__cxx11::string::~string((string *)str);
    std::__cxx11::string::~string((string *)&statistics_path);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::~string((string *)&s_log_test);
    std::__cxx11::string::~string((string *)local_9c8);
    std::__cxx11::string::~string((string *)&arguments_json);
    system("mkdir -p ../data/neural-networks");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s_log_test,
                   "../data/neural-networks/",&nn_id);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s_log_test,
                   ".txt");
    std::__cxx11::string::~string((string *)&s_log_test);
    Neural_Network::write_file
              (max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
               super__Vector_impl_data._M_start + local_c44,(string *)str);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar6 = std::operator<<(poVar6,"Written best agent\'s neural network to ");
    std::operator<<(poVar6,(string *)str);
    std::__cxx11::string::~string((string *)str);
  }
  if (Arguments::non_interactive == true) {
    Arguments::create_json_abi_cxx11_();
    arguments_json._M_dataplus._M_p = (pointer)&arguments_json.field_2;
    arguments_json._M_string_length = 0;
    arguments_json.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&s_log_test,(string *)&arguments_json,_S_out|_S_in);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_b10,&arguments);
    write_json(&local_b10,
               (ostream *)
               &s_log_test.Q.c.super__Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>.
                _M_impl.super__Deque_impl_data._M_map_size);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_b10);
    system("mkdir -p ../data/statistics");
    statistics_path._M_dataplus._M_p = (pointer)&statistics_path.field_2;
    statistics_path._M_string_length = 0;
    statistics_path.field_2._M_local_buf[0] = '\0';
    if (PVar2 == RL) {
      std::__cxx11::string::substr((ulong)&local_bf0,(ulong)&nn_id);
      std::operator+(&local_9c8[0].first,"../data/statistics/",&local_bf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                     &local_9c8[0].first,".json");
    }
    else {
      id_abi_cxx11_();
      std::operator+(&local_9c8[0].first,"../data/statistics/",&local_bf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                     &local_9c8[0].first,"-test.json");
    }
    std::__cxx11::string::operator=((string *)&statistics_path,(string *)str);
    std::__cxx11::string::~string((string *)str);
    std::__cxx11::string::~string((string *)local_9c8);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::ofstream::ofstream(str);
    std::ofstream::open((string *)str,(_Ios_Openmode)&statistics_path);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (local_9c8,(char (*) [10])"arguments",&local_bf0);
    std::__cxx11::to_string(&local_a40,(double)local_c20);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (local_9c8 + 1,(char (*) [5])"wins",&local_a40);
    std::__cxx11::to_string(&local_a60,(double)local_c10);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (local_9c8 + 2,(char (*) [11])"completion",&local_a60);
    Statistics::avg(&local_9e0,&s_log);
    std::__cxx11::to_string(&local_a80,local_9e0.mse);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (local_9c8 + 3,(char (*) [4])"mse",&local_a80);
    if (PVar2 == RL) {
      std::operator+(&local_ae0,'\"',&nn_id);
      std::operator+(&local_ac0,&local_ae0,'\"');
    }
    else {
      std::__cxx11::string::string((string *)&local_ac0,"null",(allocator *)&local_ae0);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_8c8,(char (*) [15])"neural_network",&local_ac0);
    __val = time((time_t *)0x0);
    std::__cxx11::to_string(&local_aa0,__val);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_888,(char (*) [10])"timestamp",&local_aa0);
    __l._M_len = 6;
    __l._M_array = local_9c8;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&json,__l,&local_c21);
    lVar7 = 0x140;
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&local_9c8[0].first._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x40;
    } while (lVar7 != -0x40);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_ac0);
    if (PVar2 == RL) {
      std::__cxx11::string::~string((string *)&local_ae0);
    }
    std::__cxx11::string::~string((string *)&local_a80);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_b28,&json);
    write_json(&local_b28,(ostream *)str);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_b28);
    std::ofstream::close();
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator+(&local_9c8[0].first,"Written statistics information to ",&statistics_path);
    std::operator<<(poVar6,(string *)local_9c8);
    std::__cxx11::string::~string((string *)local_9c8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_b40,&json);
    write_json(&local_b40,(ostream *)&std::cerr);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_b40);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&json);
    std::ofstream::~ofstream(str);
    std::__cxx11::string::~string((string *)&statistics_path);
    std::__cxx11::stringstream::~stringstream((stringstream *)&s_log_test);
    std::__cxx11::string::~string((string *)&arguments_json);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&arguments);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&nn_id);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector(&last_nns);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector(&max_nns);
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)&s_test.Q);
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)&s_log.Q);
  Game::~Game(&game);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout.setf(ios::fixed);
    cout.precision(1);

    Arguments::init(argc, argv);
    Arguments::postprocess();

    srand(Arguments::random_seed);

    Game game;

    game.load_maze();

    Agent* pacman_ai;

    switch (Arguments::pacman_ai_agent) {
        case PATHFINDING: pacman_ai = new Pathfinding_Pacman_Agent(); break;
        case INPUT: pacman_ai = new Input_Pacman_Agent(); break;
        case RANDOM: pacman_ai = new Random_Pacman_Agent(); break;
        case RL: pacman_ai = new RL_Pacman_Agent(); break;
        case NN: pacman_ai = new NN_Pacman_Agent(Arguments::neural_network_path); break;
        default: ensure(false, "Invalid pacman AI Agent enum value");
    }

    game.set_ai(pacman_ai);

    Statistics s_log(Arguments::logging_statistics_precision);
    Statistics s_test(Arguments::test_statistics_precision);

    double max_win_ratio = -1;
    vector<Neural_Network> max_nns(Arguments::test_sampling);
    vector<Neural_Network> last_nns(Arguments::test_sampling);


    bool is_rl = Arguments::pacman_ai_agent == RL;
    cout << "Wins || Completion" << (is_rl ? " || MSE" : "") <<  " (Last " << s_log.precision << " :: Always)" << endl;

    /** TRAINING STAGE **/
    int i_start_evaluation = Arguments::plays*Arguments::nn_evaluation_start;
    for (int i = 0; i < Arguments::plays; ++i) {
        if (is_rl and i%Arguments::test_sampling_interval == 0)
            last_nns[(i%Arguments::test_statistics_precision)/Arguments::test_sampling_interval].from_weights(((RL_Pacman_Agent *) (pacman_ai))->nn);

        game.play();

        double mse = is_rl ? ((RL_Pacman_Agent*)(pacman_ai))->mse_sum_last/game.state.round : 0;
        StatisticInfo info(game.result, mse);
        s_log.new_observation(info);
        s_test.new_observation(info);

        double win_ratio_test;
        if (i >= i_start_evaluation and is_rl) {
            if (Arguments::nn_evaluation_attribute == WINS) win_ratio_test = s_test.avg().won;
            else win_ratio_test = s_test.avg().completion;

            if (win_ratio_test > max_win_ratio) {
                max_win_ratio = win_ratio_test;
                for (uint j = 0; j < max_nns.size(); ++j) max_nns[j].from_weights(last_nns[j]);
            }
        }

        if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
            cout << "\r";
            print_info(s_log, is_rl);
            if (is_rl and i >= i_start_evaluation) cout << " ** Max wins: " << 100*max_win_ratio;
            cout << "  ";
            cout.flush();
        }

        game.reset();
    }

    string nn_id;

    double maxtestcompletion;
    double maxtestwins;
    /** TESTING STAGE **/
    if (is_rl and max_nns[0].reserved) {
        int maxtest = -1;
        double maxtestevaluation = -1;

        for (uint j = 0; j < max_nns.size(); ++j) {
            cout << endl << "Testing best agent: Wins || Completion ("
                 << Arguments::test_statistics_precision - j*Arguments::test_sampling_interval << " before)" << endl;

            Game game_test;
            game_test.load_maze();
            pacman_ai = new NN_Pacman_Agent(max_nns[j]);
            game_test.set_ai(pacman_ai);

            Statistics s_log_test(Arguments::logging_statistics_precision);
            StatisticInfo avg;

            for (int i = 0; i < Arguments::n_games_test; ++i) {
                game_test.play();

                s_log_test.new_observation(StatisticInfo(game_test.result));

                if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
                    avg = s_log_test.avg_always();
                    cout << "\r[" << int(s_log_test.totals_always.won) << "/" << s_log_test.observation_count << "] "
                         << 100*avg.won << "% || " << 100*avg.completion << "%";

                    cout.flush();
                }

                game_test.reset();
            }

            if (Arguments::nn_evaluation_attribute == WINS and avg.won > maxtestevaluation) {
                maxtestevaluation = avg.won;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;

            }
            else if (Arguments::nn_evaluation_attribute == COMPLETION and avg.completion > maxtestevaluation) {
                maxtestevaluation = avg.completion;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;
            }
        }

        nn_id = "nn" + id() + "-" + pad(to_string(int(1000*maxtestevaluation)), '0', 3);

        system("mkdir -p ../data/neural-networks");
        string nn_path = "../data/neural-networks/" + nn_id + ".txt";
        max_nns[maxtest].write_file(nn_path);
        cout << endl << "Written best agent's neural network to " << nn_path;
    }

    if (Arguments::non_interactive) {
        vector<pair<string, string>> arguments = Arguments::create_json();

        string arguments_json;
        stringstream ss(arguments_json);
        write_json(arguments, ss);

        system("mkdir -p ../data/statistics");

        string statistics_path;
        if (is_rl)
            statistics_path = "../data/statistics/" + nn_id.substr(2) + ".json";
        else
            statistics_path = "../data/statistics/" + id() + "-test.json";

        ofstream file;
        file.open(statistics_path);

        vector<pair<string, string>> json = {
                { "arguments", ss.str() },
                { "wins", to_string(maxtestwins) },
                { "completion", to_string(maxtestcompletion) },
                { "mse", to_string(s_log.avg().mse) },
                { "neural_network", (is_rl ? ('"' + nn_id + '"') : "null") },
                { "timestamp", to_string(time(0)) }
        };

        write_json(json, file);

        file.close();

        cout << endl << "Written statistics information to " + statistics_path;

        write_json(json, cerr);
    }

    cout << endl;
}